

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

Future<signed_char> * __thiscall
Omega_h::Mesh::isync_array<signed_char>
          (Future<signed_char> *__return_storage_ptr__,Mesh *this,Int ent_dim,Read<signed_char> *a,
          Int width)

{
  bool bVar1;
  Write<signed_char> local_170;
  Write<signed_char> local_160;
  Dist local_150;
  Dist local_c0;
  
  bVar1 = could_be_shared(this,ent_dim);
  if (bVar1) {
    ask_dist(&local_c0,this,ent_dim);
    Dist::invert(&local_150,&local_c0);
    Write<signed_char>::Write(&local_170,&a->write_);
    Dist::iexch<signed_char>
              (__return_storage_ptr__,&local_150,(Read<signed_char> *)&local_170,width);
    Write<signed_char>::~Write(&local_170);
    Dist::~Dist(&local_150);
    Dist::~Dist(&local_c0);
  }
  else {
    Write<signed_char>::Write(&local_160,&a->write_);
    Future<signed_char>::Future(__return_storage_ptr__,(Read<signed_char> *)&local_160);
    Write<signed_char>::~Write(&local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

Future<T> Mesh::isync_array(Int ent_dim, Read<T> a, Int width) {
  if (!could_be_shared(ent_dim)) {
    return Future<T>(a);
  }
  return ask_dist(ent_dim).invert().iexch(a, width);
}